

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a7919c::HandleCreateLinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  size_type sVar5;
  cmArgumentParser<Arguments> *pcVar6;
  reference __rhs;
  ulong uVar7;
  cmMakefile *pcVar8;
  ostream *poVar9;
  static_string_view sVar10;
  byte local_66b;
  string local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  Status local_580;
  Status copied;
  cmAlphaNum local_558;
  cmAlphaNum local_528;
  string local_4f8;
  Status local_4d8;
  Status linked_1;
  cmAlphaNum local_4b0;
  cmAlphaNum local_480;
  string local_450;
  Status local_42c;
  Status linked;
  bool completed;
  string local_400 [32];
  string_view local_3e0;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ostringstream e;
  Status local_238;
  string_view local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string_view local_1e0;
  undefined1 local_1d0 [8];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_158;
  undefined1 local_148 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmArgumentParser<Arguments> local_d8;
  const_reference local_68;
  string *newFileName;
  string *fileName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "CREATE_LINK must be called with at least two additional arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_005b41f7;
  }
  newFileName = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,1);
  local_68 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
  if (((anonymous_namespace)::
       HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_d8);
    sVar10 = ::cm::operator____s("RESULT",6);
    pcVar6 = cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::__cxx11::string>
                       ((cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                         *)&local_d8,sVar10,0);
    sVar10 = ::cm::operator____s("COPY_ON_ERROR",0xd);
    pcVar6 = cmArgumentParser<Arguments>::Bind<bool>(pcVar6,sVar10,0x20);
    sVar10 = ::cm::operator____s("SYMBOLIC",8);
    pcVar6 = cmArgumentParser<Arguments>::Bind<bool>(pcVar6,sVar10,0x21);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleCreateLinkCommand::parser,pcVar6);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_d8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCreateLinkCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arguments.CopyOnError);
  local_168 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
  local_158 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_168,3);
  cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_148,
             (cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&HandleCreateLinkCommand::parser,&local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&arguments.CopyOnError,0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments.CopyOnError);
  pcVar1 = local_20;
  if (bVar2) {
    std::__cxx11::string::string((string *)local_1d0);
    _Var3 = std::operator==(newFileName,local_68);
    if (_Var3) {
      std::__cxx11::string::operator=
                ((string *)local_1d0,"CREATE_LINK cannot use same file and newfile");
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar8 = cmExecutionStatus::GetMakefile(local_20);
        local_1e0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d0);
        cmMakefile::AddDefinition(pcVar8,(string *)local_148,local_1e0);
        args_local._7_1_ = 1;
        result.field_2._12_4_ = 1;
      }
      else {
        cmExecutionStatus::SetError(local_20,(string *)local_1d0);
        args_local._7_1_ = 0;
        result.field_2._12_4_ = 1;
      }
    }
    else {
      if ((arguments.Result.field_2._M_local_buf[9] & 1U) == 0) {
        bVar2 = cmsys::SystemTools::FileExists(newFileName);
        if (!bVar2) {
          std::operator+(&local_220,"Cannot hard link \'",newFileName);
          std::operator+(&local_200,&local_220,"\' as it does not exist.");
          std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            pcVar8 = cmExecutionStatus::GetMakefile(local_20);
            local_230 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_1d0);
            cmMakefile::AddDefinition(pcVar8,(string *)local_148,local_230);
            args_local._7_1_ = 1;
            result.field_2._12_4_ = 1;
          }
          else {
            cmExecutionStatus::SetError(local_20,(string *)local_1d0);
            args_local._7_1_ = 0;
            result.field_2._12_4_ = 1;
          }
          goto LAB_005b41a7;
        }
      }
      bVar2 = cmsys::SystemTools::FileExists(local_68);
      if (bVar2) {
LAB_005b3b72:
        local_238 = cmsys::SystemTools::RemoveFile(local_68);
        bVar2 = cmsys::Status::operator_cast_to_bool(&local_238);
        local_66b = bVar2 ^ 0xff;
      }
      else {
        bVar2 = cmsys::SystemTools::FileIsSymlink(local_68);
        local_66b = 0;
        if (bVar2) goto LAB_005b3b72;
      }
      if ((local_66b & 1) == 0) {
        linked.Kind_._3_1_ = Success >> 0x18;
        if ((arguments.Result.field_2._M_local_buf[9] & 1U) == 0) {
          local_4d8 = cmSystemTools::CreateLinkQuietly(newFileName,local_68);
          bVar2 = cmsys::Status::operator_cast_to_bool(&local_4d8);
          if (bVar2) {
            linked.Kind_._3_1_ = 1;
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_528,"failed to create link \'");
            cmAlphaNum::cmAlphaNum(&local_558,local_68);
            cmsys::Status::GetString_abi_cxx11_((string *)&copied,&local_4d8);
            cmStrCat<char[4],std::__cxx11::string>
                      (&local_4f8,&local_528,&local_558,(char (*) [4])0xd5817c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copied)
            ;
            std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_4f8);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::__cxx11::string::~string((string *)&copied);
          }
        }
        else {
          local_42c = cmSystemTools::CreateSymlinkQuietly(newFileName,local_68);
          bVar2 = cmsys::Status::operator_cast_to_bool(&local_42c);
          if (bVar2) {
            linked.Kind_._3_1_ = 1;
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_480,"failed to create symbolic link \'");
            cmAlphaNum::cmAlphaNum(&local_4b0,local_68);
            cmsys::Status::GetString_abi_cxx11_((string *)&linked_1,&local_42c);
            cmStrCat<char[4],std::__cxx11::string>
                      (&local_450,&local_480,&local_4b0,(char (*) [4])0xd5817c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &linked_1);
            std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_450);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&linked_1);
          }
        }
        if (((linked.Kind_._3_1_ & 1) == Success >> 0x18) &&
           ((arguments.Result.field_2._M_local_buf[8] & 1U) != 0)) {
          local_580 = cmsys::SystemTools::CopyFileAlways(newFileName,local_68);
          bVar2 = cmsys::Status::operator_cast_to_bool(&local_580);
          if (bVar2) {
            linked.Kind_._3_1_ = 1;
          }
          else {
            cmsys::Status::GetString_abi_cxx11_(&local_5c0,&local_580);
            std::operator+(&local_5a0,"Copy failed: ",&local_5c0);
            std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_5a0);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::__cxx11::string::~string((string *)&local_5c0);
          }
        }
        if ((linked.Kind_._3_1_ & 1) == Success >> 0x18) {
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) != 0) {
            cmExecutionStatus::SetError(local_20,(string *)local_1d0);
            args_local._7_1_ = 0;
            result.field_2._12_4_ = 1;
            goto LAB_005b41a7;
          }
        }
        else {
          std::__cxx11::string::operator=((string *)local_1d0,"0");
        }
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pcVar8 = cmExecutionStatus::GetMakefile(local_20);
          value = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d0);
          cmMakefile::AddDefinition(pcVar8,(string *)local_148,value);
        }
        args_local._7_1_ = 1;
        result.field_2._12_4_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        poVar9 = std::operator<<((ostream *)local_3b0,"Failed to create link \'");
        poVar9 = std::operator<<(poVar9,(string *)local_68);
        poVar9 = std::operator<<(poVar9,"\' because existing path cannot be removed: ");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar9 = std::operator<<(poVar9,local_3d0);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string(local_3d0);
        uVar7 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        bVar2 = (uVar7 & 1) != 0;
        if (bVar2) {
          std::__cxx11::ostringstream::str();
          cmExecutionStatus::SetError(pcVar1,(string *)&linked.field_1);
          std::__cxx11::string::~string((string *)&linked.field_1);
        }
        else {
          pcVar8 = cmExecutionStatus::GetMakefile(local_20);
          std::__cxx11::ostringstream::str();
          local_3e0 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view(local_400);
          cmMakefile::AddDefinition(pcVar8,(string *)local_148,local_3e0);
          std::__cxx11::string::~string(local_400);
        }
        args_local._7_1_ = !bVar2;
        result.field_2._12_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      }
    }
LAB_005b41a7:
    std::__cxx11::string::~string((string *)local_1d0);
  }
  else {
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&arguments.CopyOnError);
    std::operator+(&local_1a8,"unknown argument: \"",__rhs);
    std::operator+(&local_188,&local_1a8,'\"');
    cmExecutionStatus::SetError(pcVar1,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    args_local._7_1_ = 0;
    result.field_2._12_4_ = 1;
  }
  HandleCreateLinkCommand::Arguments::~Arguments((Arguments *)local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.CopyOnError);
LAB_005b41f7:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleCreateLinkCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("CREATE_LINK must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    status.SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, e.str());
      return true;
    }
    status.SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    cmsys::Status linked =
      cmSystemTools::CreateSymlinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create symbolic link '", newFileName,
                        "': ", linked.GetString());
    }
  } else {
    cmsys::Status linked =
      cmSystemTools::CreateLinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create link '", newFileName,
                        "': ", linked.GetString());
    }
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    cmsys::Status copied =
      cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (copied) {
      completed = true;
    } else {
      result = "Copy failed: " + copied.GetString();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    status.SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    status.GetMakefile().AddDefinition(arguments.Result, result);
  }

  return true;
}